

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void map_delete_record(JSRuntime *rt,JSMapState *s,JSMapRecord *mr)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  JSMapRecord *pJVar4;
  int64_t iVar5;
  JSValueUnion JVar6;
  JSMapRecord **ppJVar7;
  JSMapRecord **ppJVar8;
  JSValue v;
  JSValue v_00;
  
  if (mr->empty != 0) {
    return;
  }
  plVar2 = (mr->hash_link).prev;
  plVar3 = (mr->hash_link).next;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  (mr->hash_link).prev = (list_head *)0x0;
  (mr->hash_link).next = (list_head *)0x0;
  if (s->is_weak == 0) {
    iVar5 = (mr->key).tag;
    if (0xfffffff4 < (uint)iVar5) {
      JVar6 = (JSValueUnion)(mr->key).u.ptr;
      iVar1 = *JVar6.ptr;
      *(int *)JVar6.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        v.tag = iVar5;
        v.u.ptr = JVar6.ptr;
        __JS_FreeValueRT(rt,v);
      }
    }
  }
  else {
    ppJVar7 = (JSMapRecord **)((long)(mr->key).u.ptr + 0x28);
    do {
      ppJVar8 = ppJVar7;
      pJVar4 = *ppJVar8;
      ppJVar7 = &pJVar4->next_weak_ref;
    } while (pJVar4 != mr);
    *ppJVar8 = *ppJVar7;
  }
  iVar5 = (mr->value).tag;
  if (0xfffffff4 < (uint)iVar5) {
    JVar6 = (JSValueUnion)(mr->value).u.ptr;
    iVar1 = *JVar6.ptr;
    *(int *)JVar6.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v_00.tag = iVar5;
      v_00.u.ptr = JVar6.ptr;
      __JS_FreeValueRT(rt,v_00);
    }
  }
  mr->ref_count = mr->ref_count + -1;
  if (mr->ref_count == 0) {
    plVar2 = (mr->link).prev;
    plVar3 = (mr->link).next;
    plVar2->next = plVar3;
    plVar3->prev = plVar2;
    (mr->link).prev = (list_head *)0x0;
    (mr->link).next = (list_head *)0x0;
    (*(rt->mf).js_free)(&rt->malloc_state,mr);
  }
  else {
    mr->empty = 1;
    (mr->key).u.int32 = 0;
    (mr->key).tag = 3;
    (mr->value).u.int32 = 0;
    (mr->value).tag = 3;
  }
  s->record_count = s->record_count - 1;
  return;
}

Assistant:

static void map_delete_record(JSRuntime *rt, JSMapState *s, JSMapRecord *mr)
{
    if (mr->empty)
        return;
    list_del(&mr->hash_link);
    if (s->is_weak) {
        delete_weak_ref(rt, mr);
    } else {
        JS_FreeValueRT(rt, mr->key);
    }
    JS_FreeValueRT(rt, mr->value);
    if (--mr->ref_count == 0) {
        list_del(&mr->link);
        js_free_rt(rt, mr);
    } else {
        /* keep a zombie record for iterators */
        mr->empty = TRUE;
        mr->key = JS_UNDEFINED;
        mr->value = JS_UNDEFINED;
    }
    s->record_count--;
}